

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

AppendResult __thiscall
metaf::WindGroup::appendPeakWind(WindGroup *this,string *group,ReportMetadata *reportMetadata)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  undefined8 uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  AppendResult AVar10;
  ulong uVar11;
  smatch match;
  string_type local_a0;
  int local_7c;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_78;
  string_type local_58;
  char *local_38;
  
  if ((appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::pkWndRgx_abi_cxx11_
       == '\0') &&
     (iVar4 = __cxa_guard_acquire(&appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)
                                   ::pkWndRgx_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::
                pkWndRgx_abi_cxx11_,"(\\d\\d0)([1-9]?\\d\\d)/(\\d\\d)?(\\d\\d)",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::
                  pkWndRgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::
                         pkWndRgx_abi_cxx11_);
  }
  local_78.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_begin._M_current = (char *)0x0;
  local_78.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s._M_current = (group->_M_dataplus)._M_p;
  bVar3 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + group->_M_string_length),&local_78,
                     &appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::
                      pkWndRgx_abi_cxx11_,0);
  AVar10 = GROUP_INVALIDATED;
  if (!bVar3) goto LAB_001a6903;
  this->windType = PEAK_WIND;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&local_a0,&local_78,1);
  if (local_a0._M_string_length == 3) {
    iVar4 = std::__cxx11::string::compare((char *)&local_a0);
    if (iVar4 == 0) {
      group._0_4_ = 0;
      group._4_4_ = NOT_REPORTED;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_a0);
      if (iVar4 == 0) {
        group._0_4_ = 0;
        group._4_4_ = VARIABLE;
      }
      else {
        bVar3 = false;
        if (local_a0._M_dataplus._M_p[2] != '0') goto LAB_001a663a;
        if (local_a0._M_string_length < 3) goto LAB_001a664e;
        lVar7 = 0;
        uVar8 = 0;
        do {
          if (9 < (byte)(local_a0._M_dataplus._M_p[lVar7] - 0x30U)) goto LAB_001a663a;
          uVar8 = (uint)(byte)(local_a0._M_dataplus._M_p[lVar7] - 0x30U) + uVar8 * 10;
          lVar7 = lVar7 + 1;
        } while ((int)lVar7 != 3);
        group = (string *)((ulong)uVar8 | 0x300000000);
      }
    }
    bVar3 = true;
  }
  else {
LAB_001a663a:
    bVar3 = false;
  }
LAB_001a664e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) goto LAB_001a6903;
  this->windDir = (Direction)group;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&local_a0,&local_78,2);
  if ((local_a0._M_string_length == 0) ||
     (iVar4 = std::__cxx11::string::compare((char *)&local_a0), iVar4 == 0)) {
    bVar3 = false;
LAB_001a66cf:
    uVar9 = 0;
    uVar11 = 0;
  }
  else {
    bVar3 = true;
    if (local_a0._M_string_length != 3) {
      if (local_a0._M_string_length == 2) goto LAB_001a67dd;
      goto LAB_001a66cf;
    }
    if (*local_a0._M_dataplus._M_p == '0') goto LAB_001a66cf;
LAB_001a67dd:
    uVar9 = 0;
    uVar8 = 0;
    do {
      if (9 < (byte)(local_a0._M_dataplus._M_p[uVar9] - 0x30U)) goto LAB_001a66cf;
      uVar8 = (uint)(byte)(local_a0._M_dataplus._M_p[uVar9] - 0x30U) + uVar8 * 10;
      uVar9 = uVar9 + 1;
    } while ((uVar9 & 0xffffffff) < local_a0._M_string_length);
    uVar11 = 0x100000000;
    uVar9 = (ulong)uVar8;
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) goto LAB_001a6903;
  (this->wSpeed).speedValue.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_payload_base<unsigned_int>)(uVar11 | uVar9);
  (this->wSpeed).speedUnit = KNOTS;
  if ((reportMetadata->reportTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_engaged == false) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_a0,&local_78,3);
    sVar2 = local_a0._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (sVar2 == 0) goto LAB_001a6903;
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&local_a0,&local_78,3);
  if (local_a0._M_string_length == 0) {
LAB_001a67c9:
    reportMetadata =
         (ReportMetadata *)
         (ulong)(reportMetadata->reportTime).super__Optional_base<metaf::MetafTime,_true,_true>.
                _M_payload.super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.
                hourValue;
  }
  else {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_58,&local_78,3);
    _Var1._M_p = local_58._M_dataplus._M_p;
    piVar5 = __errno_location();
    iVar4 = *piVar5;
    *piVar5 = 0;
    reportMetadata = (ReportMetadata *)strtoul(_Var1._M_p,&local_38,10);
    if (local_38 == _Var1._M_p) goto LAB_001a698e;
    if (*piVar5 == 0) {
      *piVar5 = iVar4;
    }
    else if (*piVar5 == 0x22) {
      std::__throw_out_of_range("stoul");
      goto LAB_001a67c9;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&local_a0,&local_78,4);
  _Var1._M_p = local_a0._M_dataplus._M_p;
  piVar5 = __errno_location();
  local_7c = *piVar5;
  *piVar5 = 0;
  uVar9 = strtoul(_Var1._M_p,(char **)&local_58,10);
  if (local_58._M_dataplus._M_p == _Var1._M_p) {
    std::__throw_invalid_argument("stoul");
LAB_001a698e:
    uVar6 = std::__throw_invalid_argument("stoul");
    __cxa_guard_abort(&appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::
                       pkWndRgx_abi_cxx11_);
    _Unwind_Resume(uVar6);
  }
  if (*piVar5 == 0) {
LAB_001a68c1:
    *piVar5 = local_7c;
  }
  else if (*piVar5 == 0x22) {
    std::__throw_out_of_range("stoul");
    goto LAB_001a68c1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  *(undefined1 *)
   ((long)&(this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload + 4) = 0;
  (this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.hourValue =
       (uint)reportMetadata;
  (this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.minuteValue = (uint)uVar9;
  if ((this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_engaged == false) {
    (this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_engaged = true;
  }
  this->incompleteText = NONE;
  AVar10 = APPENDED;
LAB_001a6903:
  if (local_78.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return AVar10;
}

Assistant:

AppendResult WindGroup::appendPeakWind(const std::string & group,
	const ReportMetadata & reportMetadata)
{

	static const std::regex pkWndRgx("(\\d\\d0)([1-9]?\\d\\d)/(\\d\\d)?(\\d\\d)");
	static const auto matchDir = 1, matchSpeed = 2;
	static const auto matchHour = 3, matchMinute = 4;

	std::smatch match;
	if (!std::regex_match(group, match, pkWndRgx)) return AppendResult::GROUP_INVALIDATED;

	windType = Type::PEAK_WIND;
	const auto dir = Direction::fromDegreesString(match.str(matchDir));
	if (!dir.has_value()) return AppendResult::GROUP_INVALIDATED;
	windDir = *dir;

	const auto speed =
		Speed::fromString(match.str(matchSpeed), Speed::Unit::KNOTS);
	if (!speed.has_value()) return AppendResult::GROUP_INVALIDATED;
	wSpeed = *speed;

	if (!reportMetadata.reportTime.has_value() && match.str(matchHour).empty()) {
		return AppendResult::GROUP_INVALIDATED;
	}
	const unsigned int hour = match.str(matchHour).empty() ?
		reportMetadata.reportTime->hour() : (unsigned int)stoul(match.str(matchHour));
	const unsigned int minute = (unsigned int)stoul(match.str(matchMinute));
	evTime = MetafTime(hour, minute);
	incompleteText = IncompleteText::NONE;

	return AppendResult::APPENDED;
}